

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O3

int cuddSifting(DdManager *table,int lower,int upper)

{
  DdSubtable *pDVar1;
  int *piVar2;
  int *piVar3;
  void *__base;
  DdNode *pDVar4;
  DdNode *pDVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  DdNode *pDVar9;
  size_t __nmemb;
  int iVar10;
  DdNode *moves;
  DdHalfWord y;
  
  iVar8 = table->size;
  __nmemb = (size_t)iVar8;
  piVar3 = (int *)malloc(__nmemb * 4);
  entry = piVar3;
  if (piVar3 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar8 = 0;
  }
  else {
    __base = malloc(__nmemb * 4);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
LAB_0080c2b9:
      if (entry != (int *)0x0) {
        free(entry);
        entry = (int *)0x0;
      }
      iVar8 = 0;
      if (__base != (void *)0x0) {
        free(__base);
        iVar8 = 0;
      }
    }
    else {
      if (0 < iVar8) {
        pDVar1 = table->subtables;
        piVar2 = table->perm;
        sVar6 = 0;
        do {
          piVar3[sVar6] = pDVar1[piVar2[sVar6]].keys;
          *(int *)((long)__base + sVar6 * 4) = (int)sVar6;
          sVar6 = sVar6 + 1;
        } while (__nmemb != sVar6);
      }
      qsort(__base,__nmemb,4,ddUniqueCompare);
      iVar10 = table->siftMaxVar;
      if (iVar8 < table->siftMaxVar) {
        iVar10 = iVar8;
      }
      if (0 < iVar10) {
        lVar7 = 0;
        do {
          if (table->siftMaxSwap <= ddTotalNumberSwapping) break;
          y = table->perm[*(int *)((long)__base + lVar7 * 4)];
          if (((int)y <= upper && lower <= (int)y) && (table->subtables[(int)y].bindVar != 1)) {
            iVar10 = table->keys - table->isolated;
            if (y == lower) {
              pDVar4 = (DdNode *)ddSiftingDown(table,lower,upper);
              if (pDVar4 == (DdNode *)0xffffffffffffffff) {
LAB_0080c2f8:
                pDVar4 = (DdNode *)0xffffffffffffffff;
                moves = (DdNode *)0x0;
                goto LAB_0080c30d;
              }
              iVar10 = ddSiftingBackward(table,iVar10,(Move *)pDVar4);
              moves = (DdNode *)0x0;
LAB_0080c1d8:
              if (iVar10 != 0) {
                if (pDVar4 != (DdNode *)0x0) {
                  pDVar5 = table->nextFree;
                  do {
                    pDVar9 = pDVar4;
                    pDVar4 = (pDVar9->type).kids.T;
                    pDVar9->ref = 0;
                    pDVar9->next = pDVar5;
                    pDVar5 = pDVar9;
                  } while (pDVar4 != (DdNode *)0x0);
                  table->nextFree = pDVar9;
                }
LAB_0080c22b:
                if (moves != (DdNode *)0x0) {
                  pDVar4 = table->nextFree;
                  do {
                    pDVar5 = moves;
                    moves = (pDVar5->type).kids.T;
                    pDVar5->ref = 0;
                    pDVar5->next = pDVar4;
                    pDVar4 = pDVar5;
                  } while (moves != (DdNode *)0x0);
                  table->nextFree = pDVar5;
                }
                goto LAB_0080c258;
              }
            }
            else if (upper == y) {
              moves = (DdNode *)ddSiftingUp(table,upper,lower);
              if (moves == (DdNode *)0xffffffffffffffff) {
LAB_0080c304:
                moves = (DdNode *)0xffffffffffffffff;
              }
              else {
                iVar10 = ddSiftingBackward(table,iVar10,(Move *)moves);
                if (iVar10 != 0) goto LAB_0080c22b;
              }
              pDVar4 = (DdNode *)0x0;
            }
            else if ((int)(upper - y) < (int)(y - lower)) {
              pDVar4 = (DdNode *)ddSiftingDown(table,y,upper);
              if (pDVar4 != (DdNode *)0x0) {
                if (pDVar4 == (DdNode *)0xffffffffffffffff) goto LAB_0080c2f8;
                y = pDVar4->ref;
              }
              pDVar5 = (DdNode *)ddSiftingUp(table,y,lower);
              moves = pDVar5;
              if (pDVar5 != (DdNode *)0xffffffffffffffff) {
LAB_0080c1c9:
                iVar10 = ddSiftingBackward(table,iVar10,(Move *)pDVar5);
                goto LAB_0080c1d8;
              }
              moves = (DdNode *)0xffffffffffffffff;
            }
            else {
              moves = (DdNode *)ddSiftingUp(table,y,lower);
              if (moves != (DdNode *)0x0) {
                if (moves == (DdNode *)0xffffffffffffffff) goto LAB_0080c304;
                y = moves->index;
              }
              pDVar5 = (DdNode *)ddSiftingDown(table,y,upper);
              pDVar4 = pDVar5;
              if (pDVar5 != (DdNode *)0xffffffffffffffff) goto LAB_0080c1c9;
              pDVar4 = (DdNode *)0xffffffffffffffff;
            }
LAB_0080c30d:
            if ((undefined1 *)0x1 < (undefined1 *)((long)&pDVar4->index + 1U)) {
              pDVar5 = table->nextFree;
              do {
                pDVar9 = pDVar4;
                pDVar4 = (pDVar9->type).kids.T;
                pDVar9->ref = 0;
                pDVar9->next = pDVar5;
                pDVar5 = pDVar9;
              } while (pDVar4 != (DdNode *)0x0);
              table->nextFree = pDVar9;
            }
            if ((undefined1 *)0x1 < (undefined1 *)((long)&moves->index + 1U)) {
              pDVar4 = table->nextFree;
              do {
                pDVar5 = moves;
                moves = (pDVar5->type).kids.T;
                pDVar5->ref = 0;
                pDVar5->next = pDVar4;
                pDVar4 = pDVar5;
              } while (moves != (DdNode *)0x0);
              table->nextFree = pDVar5;
            }
            goto LAB_0080c2b9;
          }
LAB_0080c258:
          lVar7 = lVar7 + 1;
          iVar10 = table->siftMaxVar;
          if (iVar8 < table->siftMaxVar) {
            iVar10 = iVar8;
          }
        } while (lVar7 < iVar10);
      }
      free(__base);
      iVar8 = 1;
      if (entry != (int *)0x0) {
        free(entry);
        entry = (int *)0x0;
      }
    }
  }
  return iVar8;
}

Assistant:

int
cuddSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,(size_t)size,sizeof(int),(DD_QSFP)ddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar,size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->perm[var[i]];

        if (x < lower || x > upper || table->subtables[x].bindVar == 1)
            continue;
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        result = ddSiftingAux(table, x, lower, upper);
        if (!result) goto cuddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keys < (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"-");
        } else if (table->keys > (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->err,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keys - table->isolated, var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(entry);

    return(1);

cuddSiftingOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}